

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  bool *pbVar1;
  double *pdVar2;
  long lVar3;
  undefined1 local_58 [32];
  double local_38;
  double dStack_30;
  
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  lVar3 = 0;
  do {
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_58,fmt,(IVal *)(&(value->m_data).m_data[0].m_data[0].m_hasNaN + lVar3))
    ;
    pdVar2 = (double *)((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[1].m_lo + lVar3);
    *pdVar2 = local_38;
    pdVar2[1] = dStack_30;
    pdVar2 = (double *)((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi + lVar3);
    *pdVar2 = (double)local_58._16_8_;
    pdVar2[1] = (double)local_58._24_8_;
    pbVar1 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = local_58._0_8_;
    *(undefined8 *)(pbVar1 + 8) = local_58._8_8_;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x90);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}